

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O0

string * __thiscall
cmCPackIFWPackage::GetComponentName_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackIFWPackage *this,cmCPackComponent *component)

{
  char *pcVar1;
  allocator local_a1;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  char *local_40;
  char *option;
  allocator local_21;
  cmCPackComponent *local_20;
  cmCPackComponent *component_local;
  cmCPackIFWPackage *this_local;
  
  local_20 = component;
  component_local = (cmCPackComponent *)this;
  this_local = (cmCPackIFWPackage *)__return_storage_ptr__;
  if (component == (cmCPackComponent *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    cmsys::SystemTools::UpperCase(&local_a0,&component->Name);
    std::operator+(&local_80,"CPACK_IFW_COMPONENT_",&local_a0);
    std::operator+(&local_60,&local_80,"_NAME");
    pcVar1 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    local_40 = pcVar1;
    if (pcVar1 == (char *)0x0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_20);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_a1);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWPackage::GetComponentName(cmCPackComponent* component)
{
  if (!component) {
    return "";
  }
  const char* option =
    this->GetOption("CPACK_IFW_COMPONENT_" +
                    cmsys::SystemTools::UpperCase(component->Name) + "_NAME");
  return option ? option : component->Name;
}